

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O0

bool __thiscall re2::StringGenerator::RandomDigits(StringGenerator *this)

{
  ACMRandom *this_00;
  int iVar1;
  int32 iVar2;
  int32 iVar3;
  size_type sVar4;
  reference pvVar5;
  int local_20;
  int i;
  int len;
  StringGenerator *this_local;
  
  iVar1 = this->nrandom_ + -1;
  this->nrandom_ = iVar1;
  if (iVar1 < 1) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = ACMRandom::Uniform(this->acm_,this->maxlen_ + 1);
    std::vector<int,_std::allocator<int>_>::resize(&this->digits_,(long)iVar2);
    for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
      this_00 = this->acm_;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->alphabet_);
      iVar3 = ACMRandom::Uniform(this_00,(int32)sVar4);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->digits_,(long)local_20);
      *pvVar5 = iVar3;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool StringGenerator::RandomDigits() {
  if (--nrandom_ <= 0)
    return false;

  // Pick length.
  int len = acm_->Uniform(maxlen_+1);
  digits_.resize(len);
  for (int i = 0; i < len; i++)
    digits_[i] = acm_->Uniform(static_cast<int32>(alphabet_.size()));
  return true;
}